

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmLocalGenerator *lg;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer puVar4;
  element_type *peVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  byte bVar9;
  string *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  cmGeneratorTarget *this_00;
  uint uVar12;
  undefined7 in_register_00000009;
  size_type sVar13;
  _Alloc_hider _Var14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string prop;
  cmListFileBacktrace lfbt;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  string local_148;
  string local_128;
  undefined4 local_104;
  undefined1 local_100 [32];
  cmQtAutoGenInitializer *local_e0;
  string *local_d8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type *local_80;
  cmListFileBacktrace local_70;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  __node_base local_40 [2];
  
  local_104 = (undefined4)CONCAT71(in_register_00000009,ignoreMissingTarget);
  local_c8._0_8_ = (genVars->GenNameUpper)._M_len;
  local_c8._8_8_ = (genVars->GenNameUpper)._M_str;
  local_b8._0_8_ = 0xb;
  local_b8._8_8_ = (long)"WIN32_EXECUTABLE" + 5;
  views._M_len = 2;
  views._M_array = (iterator)local_c8;
  local_d8 = executable;
  cmCatViews_abi_cxx11_(&local_128,views);
  psVar10 = cmTarget::GetSafeProperty(this->GenTarget->Target,&local_128);
  sVar13 = psVar10->_M_string_length;
  if (sVar13 != 0) {
    cmMakefile::GetBacktrace(this->Makefile);
    local_70.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_100._0_8_;
    local_70.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_100._8_8_ + 8) = *(_Atomic_word *)(local_100._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_100._8_8_ + 8) = *(_Atomic_word *)(local_100._8_8_ + 8) + 1;
      }
    }
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_60,&local_70);
    if (local_70.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    pcVar2 = (psVar10->_M_dataplus)._M_p;
    local_50._M_allocated_capacity = (size_type)local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_60 + 0x10),pcVar2,pcVar2 + psVar10->_M_string_length);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_d0,(string *)local_60);
    if ((__node_base *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,
                      (ulong)((long)&(local_40[0]._M_nxt)->_M_nxt + 1));
    }
    lg = this->LocalGen;
    local_e0 = this;
    local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
    paVar1 = &local_148.field_2;
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    local_148._M_dataplus._M_p = (pointer)paVar1;
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_d0,lg,(string *)local_c8,
               (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,&local_148);
    std::__cxx11::string::_M_assign((string *)&genVars->Executable);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                               local_148.field_2._M_local_buf[0]) + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_d0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
    }
    if ((genVars->Executable)._M_string_length == 0 && (char)local_104 == '\0') {
      local_100._0_8_ = (element_type *)(local_100 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      std::__cxx11::string::append(local_100);
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(genVars->GenNameUpper)._M_len;
      puVar4 = (pointer)(genVars->GenNameUpper)._M_str;
      psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(local_e0->GenTarget);
      local_b8._0_8_ = 0xc;
      local_b8._8_8_ = (long)" set to OLD for target " + 0xb;
      local_b8._24_8_ = (psVar10->_M_dataplus)._M_p;
      local_b8._16_8_ = psVar10->_M_string_length;
      local_98 = (_Base_ptr)0x2;
      local_90 = (_Base_ptr)0x7918c1;
      local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
      local_80 = (element_type *)local_100._0_8_;
      views_00._M_len = 5;
      views_00._M_array = (iterator)local_c8;
      local_c8._0_8_ = p_Var3;
      local_c8._8_8_ = puVar4;
      cmCatViews_abi_cxx11_(&local_148,views_00);
      cmSystemTools::Error(&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      this = local_e0;
      if ((element_type *)local_100._0_8_ != (element_type *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      psVar10 = (string *)0x0;
    }
    else {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      this = local_e0;
      p_Var11->_M_use_count = 1;
      p_Var11->_M_weak_count = 1;
      p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00963960;
      p_Var11[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[1]._M_use_count = 0;
      p_Var11[1]._M_weak_count = 0;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[2]._M_use_count = 0;
      p_Var11[2]._M_weak_count = 0;
      p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[4]._M_use_count = 0;
      p_Var11[4]._M_weak_count = 0;
      p_Var11[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[3]._M_weak_count = 0;
      *(_Atomic_word **)&p_Var11[1]._M_use_count = &p_Var11[2]._M_use_count;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(undefined1 *)&p_Var11[2]._M_use_count = 0;
      p_Var11[4]._M_use_count = 0;
      p_Var11[4]._M_weak_count = 0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[3]._M_weak_count = 0;
      p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var11 + 1);
      p_Var3 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var11;
      psVar10 = (string *)&DAT_00000001;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
  }
  bVar9 = (byte)psVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if (sVar13 != 0) goto LAB_002c7d03;
  uVar12 = (this->QtVersion).Major - 4;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8._0_8_ = (element_type *)0x0;
  if (uVar12 < 3) {
    local_c8._8_8_ = &DAT_007723c8 + *(int *)(&DAT_007723c8 + (ulong)uVar12 * 4);
    local_c8._0_8_ = (element_type *)0x5;
  }
  local_b8._8_8_ = (local_d8->_M_dataplus)._M_p;
  local_b8._0_8_ = local_d8->_M_string_length;
  views_01._M_len = 2;
  views_01._M_array = (iterator)local_c8;
  cmCatViews_abi_cxx11_(&local_128,views_01);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGen,&local_128);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    if ((char)local_104 == '\0') {
      local_b8._8_8_ = (local_d8->_M_dataplus)._M_p;
      local_b8._0_8_ = local_d8->_M_string_length;
      local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      local_c8._8_8_ = "Could not find ";
      local_b8._16_8_ = 0x13;
      local_b8._24_8_ = " executable target ";
      local_98 = (_Base_ptr)local_128._M_string_length;
      local_90 = (_Base_ptr)local_128._M_dataplus._M_p;
      views_02._M_len = 4;
      views_02._M_array = (iterator)local_c8;
      cmCatViews_abi_cxx11_((string *)local_100,views_02);
      peVar5 = (element_type *)(genVars->GenNameUpper)._M_len;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(genVars->GenNameUpper)._M_str;
      psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_b8._0_8_ = 0xc;
      local_b8._8_8_ = (long)" set to OLD for target " + 0xb;
      local_b8._24_8_ = (psVar10->_M_dataplus)._M_p;
      local_b8._16_8_ = psVar10->_M_string_length;
      local_98 = (_Base_ptr)0x2;
      local_90 = (_Base_ptr)0x7918c1;
      local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
      local_80 = (element_type *)local_100._0_8_;
      views_03._M_len = 5;
      views_03._M_array = (iterator)local_c8;
      local_c8._0_8_ = peVar5;
      local_c8._8_8_ = p_Var3;
      cmCatViews_abi_cxx11_(&local_148,views_03);
      cmSystemTools::Error(&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      if ((element_type *)local_100._0_8_ != (element_type *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      bVar9 = 0;
    }
    else {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var11->_M_use_count = 1;
      p_Var11->_M_weak_count = 1;
      p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00963960;
      p_Var11[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[1]._M_use_count = 0;
      p_Var11[1]._M_weak_count = 0;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[2]._M_use_count = 0;
      p_Var11[2]._M_weak_count = 0;
      p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[4]._M_use_count = 0;
      p_Var11[4]._M_weak_count = 0;
      p_Var11[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[3]._M_weak_count = 0;
      *(_Atomic_word **)&p_Var11[1]._M_use_count = &p_Var11[2]._M_use_count;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(undefined1 *)&p_Var11[2]._M_use_count = 0;
      p_Var11[4]._M_use_count = 0;
      p_Var11[4]._M_weak_count = 0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[3]._M_weak_count = 0;
      p_Var11[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var11 + 1);
      p_Var3 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var11;
      bVar9 = 1;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&genVars->ExecutableTargetName);
    genVars->ExecutableTarget = this_00;
    bVar8 = cmGeneratorTarget::IsImported(this_00);
    if (bVar8) {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
      cmGeneratorTarget::ImportedGetLocation((string *)local_c8,this_00,&local_148);
      std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)local_c8);
      if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_b8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        sVar13 = CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                          local_148.field_2._M_local_buf[0]);
        _Var14._M_p = local_148._M_dataplus._M_p;
LAB_002c7a71:
        operator_delete(_Var14._M_p,sVar13 + 1);
      }
    }
    else {
      local_c8._0_8_ = (element_type *)(local_c8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"");
      cmGeneratorTarget::GetLocation(this_00,(string *)local_c8);
      std::__cxx11::string::_M_assign((string *)&genVars->Executable);
      sVar13 = local_b8._0_8_;
      _Var14._M_p = (pointer)local_c8._0_8_;
      if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) goto LAB_002c7a71;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if (this_00 != (cmGeneratorTarget *)0x0) {
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    cmQtAutoGenGlobalInitializer::GetCompilerFeatures
              ((cmQtAutoGenGlobalInitializer *)local_c8,(string *)this->GlobalInitializer,local_d8,
               &genVars->Executable);
    uVar7 = local_c8._8_8_;
    uVar6 = local_c8._0_8_;
    local_c8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (genVars->ExecutableFeatures).
             super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (genVars->ExecutableFeatures).
    super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar6;
    (genVars->ExecutableFeatures).
    super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    peVar5 = (genVars->ExecutableFeatures).
             super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 == (element_type *)0x0) {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(genVars->GenNameUpper)._M_len;
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(genVars->GenNameUpper)._M_str;
      psVar10 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_b8._0_8_ = 0xc;
      local_b8._8_8_ = (long)" set to OLD for target " + 0xb;
      local_b8._24_8_ = (psVar10->_M_dataplus)._M_p;
      local_b8._16_8_ = psVar10->_M_string_length;
      local_98 = (_Base_ptr)0x2;
      local_90 = (_Base_ptr)0x7918c1;
      local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length;
      local_80 = (element_type *)local_128._M_dataplus._M_p;
      views_04._M_len = 5;
      views_04._M_array = (iterator)local_c8;
      local_c8._0_8_ = p_Var3;
      local_c8._8_8_ = p_Var11;
      cmCatViews_abi_cxx11_(&local_148,views_04);
      cmSystemTools::Error(&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,
                        CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                                 local_148.field_2._M_local_buf[0]) + 1);
      }
      bVar9 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                               local_128.field_2._M_local_buf[0]) + 1);
    }
    bVar9 = peVar5 != (element_type *)0x0 | bVar9;
  }
LAB_002c7d03:
  return (bool)(bVar9 & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    cmSystemTools::Error(cmStrCat(genVars.GenNameUpper, " for target ",
                                  this->GenTarget->GetName(), ": ", err));
  };

  // Custom executable
  {
    std::string const prop = cmStrCat(genVars.GenNameUpper, "_EXECUTABLE");
    std::string const& val = this->GenTarget->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable = cge->Evaluate(this->LocalGen, "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      genVars.ExecutableFeatures =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    cm::string_view prefix;
    if (this->QtVersion.Major == 4) {
      prefix = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      prefix = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      prefix = "Qt6::";
    }
    std::string const targetName = cmStrCat(prefix, executable);

    // Find target
    cmGeneratorTarget* genTarget =
      this->LocalGen->FindGeneratorTargetToUse(targetName);
    if (genTarget) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = genTarget;
      if (genTarget->IsImported()) {
        genVars.Executable = genTarget->ImportedGetLocation("");
      } else {
        genVars.Executable = genTarget->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        genVars.ExecutableFeatures =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
        return true;
      }
      print_err(cmStrCat("Could not find ", executable, " executable target ",
                         targetName));
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err);
    if (!genVars.ExecutableFeatures) {
      print_err(err);
      return false;
    }
  }

  return true;
}